

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O2

void Centaurus::Stage3Runner::
     append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *values_next_it,int n,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  StackEntryTag SVar1;
  pointer pSVar2;
  unsigned_long *__args;
  uint uVar3;
  bool bVar4;
  StackEntryTag local_1c;
  
  pSVar2 = (tags->
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  SVar1 = pSVar2[-1];
  if (SVar1 < VALUE) {
    local_1c = n;
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::emplace_back<Centaurus::detail::StackEntryTag>(tags,&local_1c);
  }
  else {
    pSVar2[-1] = SVar1 + n;
  }
  uVar3 = ~(n >> 0x1f) & n;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    __args = values_next_it->_M_current;
    values_next_it->_M_current = __args + 1;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)values,__args);
  }
  return;
}

Assistant:

static void append_value(Iterator& values_next_it, int n, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    if (detail::isValueTag(tags.back())) {
      tags.back() = static_cast<detail::StackEntryTag>(static_cast<int>(tags.back()) + n);
    } else {
      tags.emplace_back(static_cast<detail::StackEntryTag>(n));
    }
#if PYCENTAURUS
    values.front() += n;
#else
    for (int i = 0; i < n; i++) {
      values.emplace_back(*values_next_it++);
    }
#endif
  }